

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O1

void pnga_add_constant(Integer g_a,void *alpha)

{
  long lVar1;
  Integer *pIVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Integer ndim;
  Integer type;
  Integer hi [7];
  Integer lo [7];
  Integer local_a8;
  Integer local_a0;
  Integer local_98 [7];
  Integer aIStack_60 [9];
  
  pnga_inquire(g_a,&local_a0,&local_a8,local_98);
  if (local_a8 != 0) {
    lVar1 = local_a8 + -1;
    auVar4._8_4_ = (int)lVar1;
    auVar4._0_8_ = lVar1;
    auVar4._12_4_ = (int)((ulong)lVar1 >> 0x20);
    pIVar2 = aIStack_60 + local_a8;
    uVar3 = 0;
    auVar4 = auVar4 ^ _DAT_001b2020;
    do {
      auVar5._8_4_ = (int)uVar3;
      auVar5._0_8_ = uVar3;
      auVar5._12_4_ = (int)(uVar3 >> 0x20);
      auVar5 = (auVar5 | _DAT_001b2010) ^ _DAT_001b2020;
      if ((bool)(~(auVar5._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar5._0_4_ ||
                  auVar4._4_4_ < auVar5._4_4_) & 1)) {
        *pIVar2 = 1;
      }
      if ((auVar5._12_4_ != auVar4._12_4_ || auVar5._8_4_ <= auVar4._8_4_) &&
          auVar5._12_4_ <= auVar4._12_4_) {
        pIVar2[-1] = 1;
      }
      uVar3 = uVar3 + 2;
      pIVar2 = pIVar2 + -2;
    } while ((local_a8 + 1U & 0xfffffffffffffffe) != uVar3);
    local_a8 = 0;
  }
  _ga_sync_begin = 1;
  gai_oper_elem(g_a,aIStack_60 + 1,local_98,alpha,1);
  return;
}

Assistant:

void pnga_add_constant(Integer g_a, void *alpha)
{
   Integer type, ndim;
   Integer lo[MAXDIM],hi[MAXDIM];

    pnga_inquire(g_a,  &type, &ndim, hi);
    while(ndim){
        lo[ndim-1]=1;
        ndim--;
    }
    _ga_sync_begin = 1; /*just to be on the safe side*/
    gai_oper_elem(g_a, lo, hi, alpha, OP_ADD_CONST);
}